

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O2

void BM_vlog(int n)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_90;
  
  do {
    if (n < 1) {
      return;
    }
    if (BM_vlog::vlocal__.level == (int32 *)0x0) {
      bVar1 = google::InitVLOG3__(&BM_vlog::vlocal__,&fLI::FLAGS_v,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                                  ,1);
      if (bVar1) goto LAB_00109f64;
    }
    else if (0 < *BM_vlog::vlocal__.level) {
LAB_00109f64:
      google::LogMessage::LogMessage
                (&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0xb6);
      poVar2 = google::LogMessage::stream(&local_90);
      std::operator<<(poVar2,"test message");
      google::LogMessage::~LogMessage(&local_90);
    }
    n = n + -1;
  } while( true );
}

Assistant:

static void BM_vlog(int n) {
  while (n-- > 0) {
    VLOG(1) << "test message";
  }
}